

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_os_sleep(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSValue JVar1;
  int iVar2;
  ssize_t sVar3;
  undefined4 in_ECX;
  undefined8 in_R8;
  timespec ts;
  int ret;
  int64_t delay;
  timespec local_78;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  JSContext *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 local_30;
  undefined4 uStack_2c;
  int64_t local_28;
  undefined4 uStack_c;
  
  val.tag._0_4_ = in_stack_ffffffffffffffb0;
  val.u = (JSValueUnion)in_R8;
  val.tag._4_4_ = in_ECX;
  iVar2 = JS_ToInt64(in_stack_ffffffffffffffa0,
                     (int64_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),val);
  if (iVar2 == 0) {
    if ((long)in_stack_ffffffffffffffa0 < 0) {
      in_stack_ffffffffffffffa0 = (JSContext *)0x0;
    }
    local_78.tv_sec = (long)in_stack_ffffffffffffffa0 / 1000;
    local_78.tv_nsec = ((long)in_stack_ffffffffffffffa0 % 1000) * 1000000;
    nanosleep(&local_78,(timespec *)0x0);
    sVar3 = js_get_errno(0x116fed);
    local_30 = (undefined4)sVar3;
    uStack_2c = uStack_c;
    local_28 = 0;
  }
  else {
    local_30 = 0;
    local_28 = 6;
  }
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_os_sleep(JSContext *ctx, JSValueConst this_val,
                          int argc, JSValueConst *argv)
{
    int64_t delay;
    int ret;
    
    if (JS_ToInt64(ctx, &delay, argv[0]))
        return JS_EXCEPTION;
    if (delay < 0)
        delay = 0;
#if defined(_WIN32)
    {
        if (delay > INT32_MAX)
            delay = INT32_MAX;
        Sleep(delay);
        ret = 0;
    }
#else
    {
        struct timespec ts;

        ts.tv_sec = delay / 1000;
        ts.tv_nsec = (delay % 1000) * 1000000;
        ret = js_get_errno(nanosleep(&ts, NULL));
    }
#endif
    return JS_NewInt32(ctx, ret);
}